

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecompiler.cpp
# Opt level: O2

void __thiscall asmjit::CodeCompiler::CodeCompiler(CodeCompiler *this)

{
  CodeBuilder::CodeBuilder(&this->super_CodeBuilder);
  (this->super_CodeBuilder).super_CodeEmitter._vptr_CodeEmitter =
       (_func_int **)&PTR__CodeCompiler_001435d8;
  this->_func = (CCFunc *)0x0;
  Zone::Zone(&this->_vRegZone,0xfc0,0);
  (this->_vRegArray).super_ZoneVectorBase._capacity = 0;
  this->_localConstPool = (CBConstPool *)0x0;
  (this->_vRegArray).super_ZoneVectorBase._data = (void *)0x0;
  (this->_vRegArray).super_ZoneVectorBase._length = 0;
  this->_globalConstPool = (CBConstPool *)0x0;
  (this->super_CodeBuilder).super_CodeEmitter._type = '\x03';
  return;
}

Assistant:

CodeCompiler::CodeCompiler() noexcept
  : CodeBuilder(),
    _func(nullptr),
    _vRegZone(4096 - Zone::kZoneOverhead),
    _vRegArray(),
    _localConstPool(nullptr),
    _globalConstPool(nullptr) {

  _type = kTypeCompiler;
}